

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

Instr * __thiscall LowererMDArch::LowerEntryInstr(LowererMDArch *this,EntryInstr *entryInstr)

{
  IRType type_00;
  code *pcVar1;
  bool bVar2;
  RegNum reg_00;
  BOOLEAN BVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint size;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  RegOpnd *pRVar11;
  IndirOpnd *dstOpnd;
  Instr *pIVar12;
  undefined8 uVar13;
  JITOutput *this_00;
  JITTimeFunctionBody *this_01;
  Opnd *src1Opnd;
  Instr *pIVar14;
  StackSym *sym_00;
  SymOpnd *dstOpnd_00;
  Opnd *pOVar15;
  Instr *pIVar16;
  PragmaInstr *pPVar17;
  int iVar18;
  IntConstType frameSize;
  Instr *pushInstr;
  Instr *movInstr;
  RegOpnd *rspOpnd;
  RegOpnd *rbpOpnd;
  Opnd *dst;
  StackSym *sym;
  Instr *movNullInstr;
  Opnd *opnd;
  Opnd *raxOpnd;
  Instr *movRax0;
  uint combineStackAllocationSize;
  uint32 alignmentPadding;
  uint32 totalStackSize;
  uint32 stackLocalsSize;
  uint32 stackArgsSize;
  uint32 argSlotsForFunctionsCalled;
  Instr *pushInstr_1;
  Instr *saveInstr;
  RegOpnd *regOpnd;
  IRType type;
  RegNum reg;
  uint xmmOffset;
  RegOpnd *stackPointer;
  Instr *secondInstr;
  Instr *lastPrologInstr;
  Instr *firstPrologInstr;
  uint savedRegSize;
  EntryInstr *entryInstr_local;
  LowererMDArch *this_local;
  
  firstPrologInstr._4_4_ = 0;
  pIVar16 = (entryInstr->super_Instr).m_next;
  if (pIVar16 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x639,"(secondInstr)","Instruction chain broken.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  reg_00 = GetRegStackPointer();
  pRVar10 = IR::RegOpnd::New((StackSym *)0x0,reg_00,TyInt64,this->m_func);
  regOpnd._4_4_ = 0;
  for (regOpnd._3_1_ = RegRAX; regOpnd._3_1_ < RegNumCount; regOpnd._3_1_ = regOpnd._3_1_ + RegRAX)
  {
    bVar2 = LinearScan::IsCalleeSaved(regOpnd._3_1_);
    if ((bVar2) &&
       ((BVar4 = Func::HasTry(this->m_func), BVar4 != 0 ||
        (BVar3 = BVUnitT<unsigned_long>::Test(&this->m_func->m_regsUsed,(uint)regOpnd._3_1_),
        BVar3 != '\0')))) {
      type_00 = RegTypes[regOpnd._3_1_];
      pRVar11 = IR::RegOpnd::New((StackSym *)0x0,regOpnd._3_1_,type_00,this->m_func);
      if (type_00 == TyFloat64) {
        dstOpnd = IR::IndirOpnd::New(pRVar10,regOpnd._4_4_,TyFloat64,this->m_func,false);
        pIVar12 = IR::Instr::New(MOVAPS,&dstOpnd->super_Opnd,&pRVar11->super_Opnd,this->m_func);
        regOpnd._4_4_ = regOpnd._4_4_ + 0x10;
        IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar12);
        PrologEncoder::RecordXmmRegSave(&this->m_func->m_prologEncoder);
      }
      else {
        if (type_00 != TyInt64) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0x658,"(type == TyInt64)","type == TyInt64");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pIVar12 = IR::Instr::New(PUSH,this->m_func);
        IR::Instr::SetSrc1(pIVar12,&pRVar11->super_Opnd);
        IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar12);
        PrologEncoder::RecordNonVolRegSave(&this->m_func->m_prologEncoder);
        firstPrologInstr._4_4_ = firstPrologInstr._4_4_ + 8;
      }
    }
  }
  stackLocalsSize = this->m_func->m_argSlotsForFunctionsCalled;
  bVar2 = Lowerer::IsArgSaveRequired(this->m_func);
  if (bVar2) {
    if (stackLocalsSize < 6) {
      stackLocalsSize = 6;
    }
  }
  else {
    stackLocalsSize = 0;
  }
  iVar18 = (stackLocalsSize + 1) * 8;
  iVar5 = Math::Align<int>(this->m_func->m_localStackHeight,8);
  this->m_func->m_localStackHeight = iVar5;
  uVar6 = Func::GetMaxInlineeArgOutSize(this->m_func);
  this->m_func->m_localStackHeight = uVar6 + 8 + this->m_func->m_localStackHeight;
  alignmentPadding = this->m_func->m_localStackHeight;
  if (regOpnd._4_4_ != 0) {
    alignmentPadding = Math::Align<unsigned_int>(alignmentPadding + regOpnd._4_4_,0x10);
  }
  uVar7 = alignmentPadding + iVar18 + firstPrologInstr._4_4_;
  if ((uVar7 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x688,"(0 == (totalStackSize % 8))","Stack should always be 8 byte aligned")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  iVar5 = 0;
  if ((uVar7 & 0xf) != 0) {
    iVar5 = 8;
  }
  size = iVar5 + iVar18;
  if ((regOpnd._4_4_ != 0) &&
     (uVar8 = Math::Align<unsigned_int>(size + firstPrologInstr._4_4_,0x10),
     uVar8 != size + firstPrologInstr._4_4_)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x68e,
                       "(xmmOffset == 0 || ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize)"
                       ,
                       "xmmOffset == 0 || ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (0x100000 < iVar5 + uVar7) {
    uVar13 = __cxa_allocate_exception(1);
    __cxa_throw(uVar13,&Js::OperationAbortedException::typeinfo,0);
  }
  bVar2 = Func::HasInlinee(this->m_func);
  if (bVar2) {
    this_00 = Func::GetJITOutput(this->m_func);
    JITOutput::SetFrameHeight(this_00,this->m_func->m_localStackHeight);
  }
  Func::SetArgsSize(this->m_func,size);
  Func::SetSavedRegSize(this->m_func,firstPrologInstr._4_4_);
  Func::SetSpillSize(this->m_func,alignmentPadding);
  if (pIVar16 == (entryInstr->super_Instr).m_next) {
    GenerateStackAllocation(this,pIVar16->m_prev,size + alignmentPadding);
    PrologEncoder::RecordAlloca(&this->m_func->m_prologEncoder,(ulong)(size + alignmentPadding));
  }
  else {
    GenerateStackAllocation(this,pIVar16->m_prev,size);
    PrologEncoder::RecordAlloca(&this->m_func->m_prologEncoder,(ulong)size);
    if (alignmentPadding != 0) {
      GenerateStackAllocation(this,&entryInstr->super_Instr,alignmentPadding);
      PrologEncoder::RecordAlloca(&this->m_func->m_prologEncoder,(ulong)alignmentPadding);
    }
  }
  pIVar12 = pIVar16->m_prev;
  if (pIVar12 == &entryInstr->super_Instr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x6bc,"(lastPrologInstr != entryInstr)","lastPrologInstr != entryInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  raxOpnd = (Opnd *)0x0;
  opnd = (Opnd *)0x0;
  bVar2 = Func::HasArgumentSlot(this->m_func);
  if (bVar2) {
    bVar2 = Func::IsStackArgsEnabled(this->m_func);
    if ((!bVar2) && (bVar2 = Func::IsJitInDebugMode(this->m_func), !bVar2)) {
      this_01 = Func::GetJITFunctionBody(this->m_func);
      bVar2 = JITTimeFunctionBody::IsInlineApplyDisabled(this_01);
      if (!bVar2) goto LAB_00876900;
    }
  }
  else {
LAB_00876900:
    bVar2 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutFlag);
    if ((((!bVar2) &&
         (bVar2 = Js::ConfigFlagsTable::IsEnabled
                            ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutAtEveryLineFlag),
         !bVar2)) &&
        (bVar2 = Js::ConfigFlagsTable::IsEnabled
                           ((ConfigFlagsTable *)&Js::Configuration::Global,
                            BailOutAtEveryByteCodeFlag), !bVar2)) &&
       (bVar2 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutByteCodeFlag),
       !bVar2)) goto LAB_00876a2a;
  }
  opnd = &IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyUint32,this->m_func)->super_Opnd;
  raxOpnd = (Opnd *)IR::Instr::New(XOR,opnd,opnd,opnd,this->m_func);
  IR::Instr::InsertAfter(pIVar16->m_prev,(Instr *)raxOpnd);
  pOVar15 = LowererMD::CreateStackArgumentsSlotOpnd(this->m_func);
  src1Opnd = IR::Opnd::UseWithNewType(opnd,TyInt64,this->m_func);
  pIVar14 = IR::Instr::New(MOV,pOVar15,src1Opnd,this->m_func);
  IR::Instr::InsertAfter(pIVar16->m_prev,pIVar14);
LAB_00876a2a:
  bVar2 = Func::HasInlinee(this->m_func);
  if (bVar2) {
    if (raxOpnd == (Opnd *)0x0) {
      opnd = &IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyUint32,this->m_func)->super_Opnd;
      pIVar14 = IR::Instr::New(XOR,opnd,opnd,opnd,this->m_func);
      IR::Instr::InsertAfter(pIVar16->m_prev,pIVar14);
    }
    sym_00 = SymTable::GetArgSlotSym(this->m_func->m_symTable,0xffff);
    *(uint *)&sym_00->field_0x18 = *(uint *)&sym_00->field_0x18 & 0xffffbfff | 0x4000;
    sym_00->m_offset = 0;
    dstOpnd_00 = IR::SymOpnd::New(&sym_00->super_Sym,0,TyInt64,this->m_func);
    pIVar16 = pIVar16->m_prev;
    pOVar15 = IR::Opnd::UseWithNewType(opnd,TyInt64,this->m_func);
    pIVar14 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,pOVar15,this->m_func);
    IR::Instr::InsertAfter(pIVar16,pIVar14);
  }
  pRVar10 = IR::RegOpnd::New((StackSym *)0x0,RegRBP,TyInt64,this->m_func);
  pRVar11 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  pIVar16 = IR::Instr::New(MOV,&pRVar10->super_Opnd,&pRVar11->super_Opnd,this->m_func);
  IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar16);
  pIVar16 = IR::Instr::New(PUSH,this->m_func);
  IR::Instr::SetSrc1(pIVar16,&pRVar10->super_Opnd);
  IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar16);
  PrologEncoder::RecordNonVolRegSave(&this->m_func->m_prologEncoder);
  pPVar17 = IR::PragmaInstr::New(PrologStart,0,this->m_func);
  IR::Instr::InsertBefore(pIVar16,&pPVar17->super_Instr);
  pPVar17 = IR::PragmaInstr::New(PrologEnd,0,this->m_func);
  IR::Instr::InsertAfter(pIVar12,&pPVar17->super_Instr);
  GeneratePrologueStackProbe
            (this,&entryInstr->super_Instr,
             (ulong)(size + 0x1b90 + alignmentPadding + firstPrologInstr._4_4_));
  return &entryInstr->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerEntryInstr(IR::EntryInstr * entryInstr)
{
    /*
     * push   rbp
     * mov    rbp,                       rsp
     * sub    rsp,                       localVariablesHeight + floatCalleeSavedRegsSize
     * movsdx qword ptr [rsp + 0],       xmm6  ------\
     * movsdx qword ptr [rsp + 8],       xmm7        |
     * ...                                           |
     * movsdx qword ptr [rsp + (N * 8)], xmmN        |- Callee saved registers.
     * push   rsi                                    |
     * ...                                           |
     * push   rbx                              ------/
     * sub    rsp,                       ArgumentsBacking
     */

    uint savedRegSize           = 0;
    IR::Instr *firstPrologInstr = nullptr;
    IR::Instr *lastPrologInstr  = nullptr;

    // PUSH used callee-saved registers.
    IR::Instr *secondInstr      = entryInstr->m_next;
    AssertMsg(secondInstr, "Instruction chain broken.");

    IR::RegOpnd *stackPointer   = IR::RegOpnd::New(nullptr, GetRegStackPointer(), TyMachReg, this->m_func);
    unsigned     xmmOffset      = 0;

    // PDATA doesn't seem to like two consecutive "SUB RSP, size" instructions. Temporarily save and
    // restore RBX always so that the pattern doesn't occur in the prolog.
    for (RegNum reg = (RegNum)(RegNOREG + 1); reg < RegNumCount; reg = (RegNum)(reg + 1))
    {
        if (LinearScan::IsCalleeSaved(reg) && (this->m_func->HasTry() || this->m_func->m_regsUsed.Test(reg)))
        {
            IRType       type      = RegTypes[reg];
            IR::RegOpnd *regOpnd   = IR::RegOpnd::New(nullptr, reg, type, this->m_func);

            if (type == TyFloat64)
            {
                IR::Instr *saveInstr = IR::Instr::New(Js::OpCode::MOVAPS,
                                                      IR::IndirOpnd::New(stackPointer,
                                                                         xmmOffset,
                                                                         type,
                                                                         this->m_func),
                                                      regOpnd,
                                                      this->m_func);

                xmmOffset += (MachDouble * 2);
                entryInstr->InsertAfter(saveInstr);

                m_func->m_prologEncoder.RecordXmmRegSave();
            }
            else
            {
                Assert(type == TyInt64);

                IR::Instr *pushInstr = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
                pushInstr->SetSrc1(regOpnd);
                entryInstr->InsertAfter(pushInstr);

                m_func->m_prologEncoder.RecordNonVolRegSave();
                savedRegSize += MachPtr;
            }
        }
    }
    //
    // Now that we know the exact stack size, lets fix it for alignment
    // The stack on entry would be aligned. VC++ recommends that the stack
    // should always be 16 byte aligned.
    //
    uint32 argSlotsForFunctionsCalled = this->m_func->m_argSlotsForFunctionsCalled;

    if (Lowerer::IsArgSaveRequired(this->m_func))
    {
        if (argSlotsForFunctionsCalled < IntArgRegsCount)
            argSlotsForFunctionsCalled = IntArgRegsCount;
    }
    else
    {
        argSlotsForFunctionsCalled = 0;
    }

    uint32 stackArgsSize    = MachPtr * (argSlotsForFunctionsCalled + 1);

    this->m_func->m_localStackHeight = Math::Align<int32>(this->m_func->m_localStackHeight, 8);

    // Allocate the inlined arg out stack in the locals. Allocate an additional slot so that
    // we can unconditionally clear the first slot past the current frame.
    this->m_func->m_localStackHeight += m_func->GetMaxInlineeArgOutSize() + MachPtr;

    uint32 stackLocalsSize  = this->m_func->m_localStackHeight;
    if(xmmOffset != 0)
    {
        // Xmm registers need to be saved to 16-byte-aligned addresses. The stack locals size is aligned here and the total
        // size will be aligned below, which guarantees that the offset from rsp will be 16-byte-aligned.
        stackLocalsSize = ::Math::Align(stackLocalsSize + xmmOffset, static_cast<uint32>(MachDouble * 2));
    }

    uint32 totalStackSize   = stackLocalsSize +
                              stackArgsSize   +
                              savedRegSize;

    AssertMsg(0 == (totalStackSize % 8), "Stack should always be 8 byte aligned");
    uint32 alignmentPadding = (totalStackSize % 16) ? MachPtr : 0;

    stackArgsSize += alignmentPadding;
    Assert(
        xmmOffset == 0 ||
        ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize);

    totalStackSize += alignmentPadding;
    if(totalStackSize > (1u << 20)) // 1 MB
    {
        // Total stack size is > 1 MB, let's just bail. There are things that need to be changed to allow using large stack
        // sizes, for instance in the unwind info, the offset to saved xmm registers can be (1 MB - 16) at most for the op-code
        // we're currently using (UWOP_SAVE_XMM128). To support larger offsets, we need to use a FAR version of the op-code.
        throw Js::OperationAbortedException();
    }

    if (m_func->HasInlinee())
    {
        this->m_func->GetJITOutput()->SetFrameHeight(this->m_func->m_localStackHeight);
    }

    //
    // This is the last instruction so should have been emitted before, register saves.
    // But we did not have 'savedRegSize' by then. So we saved secondInstr. We now insert w.r.t that
    // instruction.
    //
    this->m_func->SetArgsSize(stackArgsSize);
    this->m_func->SetSavedRegSize(savedRegSize);
    this->m_func->SetSpillSize(stackLocalsSize);

    if (secondInstr == entryInstr->m_next)
    {
        // There is no register save at all, just combine the stack allocation
        uint combineStackAllocationSize = stackArgsSize + stackLocalsSize;
        this->GenerateStackAllocation(secondInstr->m_prev, combineStackAllocationSize);
        m_func->m_prologEncoder.RecordAlloca(combineStackAllocationSize);
    }
    else
    {
        this->GenerateStackAllocation(secondInstr->m_prev, stackArgsSize);
        m_func->m_prologEncoder.RecordAlloca(stackArgsSize);

        // Allocate frame.
        if (stackLocalsSize)
        {
            this->GenerateStackAllocation(entryInstr, stackLocalsSize);
            m_func->m_prologEncoder.RecordAlloca(stackLocalsSize);
        }
    }

    lastPrologInstr = secondInstr->m_prev;
    Assert(lastPrologInstr != entryInstr);

    // Zero-initialize dedicated arguments slot.
    IR::Instr *movRax0 = nullptr;
    IR::Opnd *raxOpnd = nullptr;

    if ((this->m_func->HasArgumentSlot() &&
            (this->m_func->IsStackArgsEnabled() ||
            this->m_func->IsJitInDebugMode() ||
            // disabling apply inlining leads to explicit load from the zero-inited slot
            this->m_func->GetJITFunctionBody()->IsInlineApplyDisabled()))
#ifdef BAILOUT_INJECTION
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryLineFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutByteCodeFlag)
#endif
        )
    {
        // TODO: Support mov [rbp - n], IMM64
        raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyUint32, this->m_func);
        movRax0 = IR::Instr::New(Js::OpCode::XOR, raxOpnd, raxOpnd, raxOpnd, this->m_func);
        secondInstr->m_prev->InsertAfter(movRax0);

        IR::Opnd *opnd = LowererMD::CreateStackArgumentsSlotOpnd(this->m_func);
        IR::Instr *movNullInstr = IR::Instr::New(Js::OpCode::MOV, opnd, raxOpnd->UseWithNewType(TyMachReg, this->m_func), this->m_func);
        secondInstr->m_prev->InsertAfter(movNullInstr);
    }

    // Zero initialize the first inlinee frames argc.
    if (m_func->HasInlinee())
    {
        if(!movRax0)
        {
            raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyUint32, this->m_func);
            movRax0 = IR::Instr::New(Js::OpCode::XOR, raxOpnd, raxOpnd, raxOpnd, this->m_func);
            secondInstr->m_prev->InsertAfter(movRax0);
        }

        StackSym *sym           = this->m_func->m_symTable->GetArgSlotSym((Js::ArgSlot)-1);
        sym->m_isInlinedArgSlot = true;
        sym->m_offset           = 0;
        IR::Opnd *dst           = IR::SymOpnd::New(sym, 0, TyMachReg, this->m_func);
        secondInstr->m_prev->InsertAfter(IR::Instr::New(Js::OpCode::MOV,
                                                        dst,
                                                        raxOpnd->UseWithNewType(TyMachReg, this->m_func),
                                                        this->m_func));
    }

    // Generate MOV RBP, RSP
    IR::RegOpnd * rbpOpnd = IR::RegOpnd::New(nullptr, RegRBP, TyMachReg, this->m_func);
    IR::RegOpnd * rspOpnd = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);

    IR::Instr * movInstr = IR::Instr::New(Js::OpCode::MOV, rbpOpnd, rspOpnd, this->m_func);
    entryInstr->InsertAfter(movInstr);

    // Generate PUSH RBP
    IR::Instr * pushInstr = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
    pushInstr->SetSrc1(rbpOpnd);
    entryInstr->InsertAfter(pushInstr);
    m_func->m_prologEncoder.RecordNonVolRegSave();
    firstPrologInstr = pushInstr;


    //
    // Insert pragmas that tell the prolog encoder the extent of the prolog.
    //
    firstPrologInstr->InsertBefore(IR::PragmaInstr::New(Js::OpCode::PrologStart, 0, m_func));
    lastPrologInstr->InsertAfter(IR::PragmaInstr::New(Js::OpCode::PrologEnd, 0, m_func));

#ifdef _WIN32 // home registers
    //
    // Now store all the arguments in the register in the stack slots
    //
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody())
    {
        uint16 offset = 2;
        this->MovArgFromReg2Stack(entryInstr, RegRCX, 1);
        for (uint16 i = 0; i < m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetArgCount() && i < 3; i++)
        {
            switch (m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetArgType(i))
            {
            case Js::AsmJsVarType::Int:
                this->MovArgFromReg2Stack(entryInstr, i == 0 ? RegRDX : i == 1 ? RegR8 : RegR9, offset, TyInt32);
                offset++;
                break;
            case Js::AsmJsVarType::Int64:
                this->MovArgFromReg2Stack(entryInstr, i == 0 ? RegRDX : i == 1 ? RegR8 : RegR9, offset, TyInt64);
                offset++;
                break;
            case Js::AsmJsVarType::Float:
                // registers we need are contiguous, so calculate it from XMM1
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TyFloat32);
                offset++;
                break;
            case Js::AsmJsVarType::Double:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TyFloat64);
                offset++;
                break;
            case Js::AsmJsVarType::Float32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128F4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Float64x2:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128D2);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int64x2:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I2);
                offset += 2;
                break;
            default:
                Assume(UNREACHED);
            }
        }
    }
    else if (argSlotsForFunctionsCalled)
    {
        this->MovArgFromReg2Stack(entryInstr, RegRCX, 1);
        this->MovArgFromReg2Stack(entryInstr, RegRDX, 2);
        this->MovArgFromReg2Stack(entryInstr, RegR8, 3);
        this->MovArgFromReg2Stack(entryInstr, RegR9, 4);
    }
#endif  // _WIN32

    IntConstType frameSize = Js::Constants::MinStackJIT + stackArgsSize + stackLocalsSize + savedRegSize;
    this->GeneratePrologueStackProbe(entryInstr, frameSize);

    return entryInstr;
}